

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

bool __thiscall
DebugMallocImplementation::GetNumericProperty
          (DebugMallocImplementation *this,char *name,size_t *value)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  iVar2 = strcmp(name,"tcmalloc.impl.testing-portal");
  if (iVar2 == 0) {
    if (GetNumericProperty(char_const*,unsigned_long*)::ptr == '\0') {
      GetNumericProperty();
    }
    value[-1] = (size_t)GetNumericProperty::ptr;
    sVar4 = 1;
  }
  else {
    bVar1 = TCMallocImplementation::GetNumericProperty
                      (&this->super_TCMallocImplementation,name,value);
    if (!bVar1) {
      return false;
    }
    iVar2 = strcmp(name,"generic.current_allocated_bytes");
    if (iVar2 != 0) {
      return true;
    }
    sVar3 = MallocBlock::FreeQueueSize();
    sVar4 = *value - sVar3;
    if (*value < sVar3) {
      return true;
    }
  }
  *value = sVar4;
  return true;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      static DebugTestingPortal* ptr = ([] () {
        static tcmalloc::StaticStorage<DebugTestingPortal> storage;
        return storage.Construct();
      })();
      *portal = ptr;
      *value = 1;
      return true;
    }

    bool result = TCMallocImplementation::GetNumericProperty(name, value);
    if (result && (strcmp(name, "generic.current_allocated_bytes") == 0)) {
      // Subtract bytes kept in the free queue
      size_t qsize = MallocBlock::FreeQueueSize();
      if (*value >= qsize) {
        *value -= qsize;
      }
    }
    return result;
  }